

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afindic.c
# Opt level: O0

FT_Error af_indic_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  FT_CharMap charmap;
  FT_Error FVar1;
  FT_CharMap oldmap;
  FT_Face face_local;
  AF_CJKMetrics metrics_local;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar1 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar1 == 0) {
    af_cjk_metrics_init_widths(metrics,face);
    af_cjk_metrics_check_digits(metrics,face);
  }
  else {
    face->charmap = (FT_CharMap)0x0;
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

static FT_Error
  af_indic_metrics_init( AF_CJKMetrics  metrics,
                         FT_Face        face )
  {
    /* skip blue zone init in CJK routines */
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
      face->charmap = NULL;
    else
    {
      af_cjk_metrics_init_widths( metrics, face );
#if 0
      /* either need indic specific blue_chars[] or just skip blue zones */
      af_cjk_metrics_init_blues( metrics, face, af_cjk_blue_chars );
#endif
      af_cjk_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );

    return FT_Err_Ok;
  }